

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

BOOL FlushViewOfFile(LPVOID lpBaseAddress,SIZE_T dwNumberOfBytesToFlush)

{
  bool bVar1;
  int iVar2;
  CPalThread *pThread;
  PMAPPED_VIEW_LIST p_Var3;
  int *piVar4;
  int __errnum;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012dcea;
  pThread = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread,&mapping_critsec);
  p_Var3 = MAPGetViewForAddress(lpBaseAddress);
  if (p_Var3 == (PMAPPED_VIEW_LIST)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012dcea;
    iVar2 = 6;
LAB_0012dcb4:
    bVar1 = false;
  }
  else {
    if (dwNumberOfBytesToFlush == 0) {
      dwNumberOfBytesToFlush = p_Var3->NumberOfBytesToMap;
    }
    iVar2 = msync(lpBaseAddress,dwNumberOfBytesToFlush,4);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      __errnum = *piVar4;
      if (__errnum == 5) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012dcea;
        iVar2 = 0x1d;
        __errnum = 5;
      }
      else if (__errnum == 0x16) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012dcea;
        iVar2 = 0x57;
        __errnum = 0x16;
      }
      else {
        iVar2 = 0x54f;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012dcea;
      }
      strerror(__errnum);
      goto LAB_0012dcb4;
    }
    iVar2 = 0;
    bVar1 = true;
  }
  CorUnix::InternalLeaveCriticalSection(pThread,&mapping_critsec);
  if (!bVar1) {
    piVar4 = __errno_location();
    *piVar4 = iVar2;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return (uint)bVar1;
  }
LAB_0012dcea:
  abort();
}

Assistant:

BOOL
PALAPI
FlushViewOfFile(
    IN LPVOID lpBaseAddress,
    IN SIZE_T dwNumberOfBytesToFlush)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;
    PMAPPED_VIEW_LIST pView = NULL;
    BOOL fResult = TRUE;

    PERF_ENTRY(FlushViewOfFile);
    ENTRY("FlushViewOfFile(lpBaseAddress=%p, dwNumberOfBytesToFlush=%u)\n",
          lpBaseAddress, dwNumberOfBytesToFlush);

    pThread = InternalGetCurrentThread();

    InternalEnterCriticalSection(pThread, &mapping_critsec);

    pView = MAPGetViewForAddress(lpBaseAddress);
    if (NULL == pView)
    {
        ERROR("lpBaseAddress has to be the address returned by MapViewOfFile[Ex]");
        palError = ERROR_INVALID_HANDLE;
        goto Exit;
    }

    if (dwNumberOfBytesToFlush == 0)
    {
        dwNumberOfBytesToFlush = pView->NumberOfBytesToMap;
    }

    // <ROTORTODO>we should only use MS_SYNC if the file has been opened
    // with FILE_FLAG_WRITE_THROUGH
    if (msync(lpBaseAddress, dwNumberOfBytesToFlush, MS_SYNC) == -1)
    {
        if (errno == EINVAL)
        {
            WARN("msync failed; %s\n", strerror(errno));
            palError = ERROR_INVALID_PARAMETER;
        }
        else if (errno == EIO)
        {
            WARN("msync failed; %s\n", strerror(errno));
            palError = ERROR_WRITE_FAULT;
        }
        else
        {
            ERROR("msync failed; %s\n", strerror(errno));
            palError = ERROR_INTERNAL_ERROR;
        }
    }

Exit:
    InternalLeaveCriticalSection(pThread, &mapping_critsec);

    if (NO_ERROR != palError)
    {
        fResult = FALSE;
        pThread->SetLastError(palError);
    }

    LOGEXIT("FlushViewOfFile returning %d.\n", fResult);
    PERF_EXIT(FlushViewOfFile);
    return fResult;
}